

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderWindow.cpp
# Opt level: O0

bool __thiscall sf::RenderWindow::setActive(RenderWindow *this,bool active)

{
  bool bVar1;
  bool result;
  bool active_local;
  RenderWindow *this_local;
  
  this_local._7_1_ = Window::setActive(&this->super_Window,active);
  if (this_local._7_1_) {
    RenderTarget::setActive(&this->super_RenderTarget,active);
  }
  if (((active) && (this_local._7_1_)) && (bVar1 = priv::RenderTextureImplFBO::isAvailable(), bVar1)
     ) {
    priv::RenderTextureImplFBO::unbind();
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RenderWindow::setActive(bool active)
{
    bool result = Window::setActive(active);

    // Update RenderTarget tracking
    if (result)
        RenderTarget::setActive(active);

    // If FBOs are available, make sure none are bound when we
    // try to draw to the default framebuffer of the RenderWindow
    if (active && result && priv::RenderTextureImplFBO::isAvailable())
    {
        priv::RenderTextureImplFBO::unbind();

        return true;
    }

    return result;
}